

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::meshcoarsening(tetgenmesh *this)

{
  int iVar1;
  int iVar2;
  arraypool *remptlist;
  tetgenbehavior *ptVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong local_38;
  
  if (this->b->quiet == 0) {
    puts("Mesh coarsening ...");
  }
  remptlist = (arraypool *)operator_new(0x30);
  remptlist->objectbytes = 8;
  remptlist->objectsperblock = 0x400;
  remptlist->log2objectsperblock = 10;
  remptlist->objectsperblockmark = 0x3ff;
  remptlist->toparraylen = 0;
  remptlist->toparray = (char **)0x0;
  remptlist->objects = 0;
  remptlist->totalmemory = 0;
  collectremovepoints(this,remptlist);
  uVar8 = remptlist->objects;
  if (uVar8 != 0) {
    ptVar3 = this->b;
    if ((0 < (long)uVar8) && (ptVar3->verbose != 0)) {
      printf("  Removing %ld points...\n",uVar8);
      uVar8 = remptlist->objects;
      ptVar3 = this->b;
    }
    iVar1 = ptVar3->fliplinklevel;
    ptVar3->fliplinklevel = -1;
    uVar10 = 1;
    uVar4 = 0xffffffff;
    iVar9 = 0;
    local_38 = uVar8;
    while( true ) {
      this->autofliplinklevel = uVar10;
      if (1 < ptVar3->verbose) {
        pcVar7 = "auto";
        if (0 < (int)uVar4) {
          pcVar7 = "fixed";
        }
        uVar5 = (ulong)uVar10;
        if (0 < (int)uVar4) {
          uVar5 = uVar4;
        }
        printf("    Removing points [%s level = %2d] #:  %ld.\n",pcVar7,uVar5,uVar8);
        uVar8 = remptlist->objects;
      }
      if ((long)uVar8 < 1) goto LAB_0014294c;
      uVar10 = 0;
      do {
        pcVar7 = remptlist->toparray[(int)uVar10 >> ((byte)remptlist->log2objectsperblock & 0x1f)];
        lVar6 = (long)remptlist->objectbytes * (long)(int)(remptlist->objectsperblockmark & uVar10);
        iVar2 = removevertexbyflips(this,*(point *)(pcVar7 + lVar6));
        uVar8 = remptlist->objects;
        if (iVar2 != 0) {
          uVar8 = uVar8 - 1;
          *(undefined8 *)(pcVar7 + lVar6) =
               *(undefined8 *)
                (remptlist->toparray[(long)uVar8 >> ((byte)remptlist->log2objectsperblock & 0x3f)] +
                (long)remptlist->objectbytes * ((long)remptlist->objectsperblockmark & uVar8));
          remptlist->objects = uVar8;
          uVar10 = uVar10 - 1;
        }
        uVar10 = uVar10 + 1;
      } while ((long)(int)uVar10 < (long)uVar8);
      if ((long)uVar8 < 1) goto LAB_0014294c;
      ptVar3 = this->b;
      uVar4 = (ulong)(uint)ptVar3->fliplinklevel;
      if (-1 < ptVar3->fliplinklevel) break;
      if (uVar8 == local_38) {
        iVar2 = iVar9 + 1;
        if (1 < iVar9) {
          ptVar3->fliplinklevel = 100000;
          uVar4 = 100000;
        }
      }
      else {
        iVar2 = iVar9 - (uint)(0 < iVar9);
        local_38 = uVar8;
      }
      uVar10 = this->autofliplinklevel + ptVar3->fliplinklevelinc;
      iVar9 = iVar2;
    }
    if (ptVar3->verbose != 0) {
      printf("  %ld points are not removed !\n",uVar8);
    }
LAB_0014294c:
    this->b->fliplinklevel = iVar1;
  }
  arraypool::~arraypool(remptlist);
  operator_delete(remptlist,0x30);
  return;
}

Assistant:

void tetgenmesh::meshcoarsening()
{
  arraypool *remptlist;

  if (!b->quiet) {
    printf("Mesh coarsening ...\n");
  }

  // Collect the set of points to be removed
  remptlist = new arraypool(sizeof(point *), 10);
  collectremovepoints(remptlist);

  if (remptlist->objects == 0l) {
    delete remptlist;
    return;
  }

  if (b->verbose) {
    if (remptlist->objects > 0l) {
      printf("  Removing %ld points...\n", remptlist->objects);
    }
  }

  point *parypt, *plastpt;
  long ms = remptlist->objects;
  int nit = 0; 
  int bak_fliplinklevel = b->fliplinklevel;
  b->fliplinklevel = -1;
  autofliplinklevel = 1; // Init value.
  int i;

  while (1) {
  
    if (b->verbose > 1) {
      printf("    Removing points [%s level = %2d] #:  %ld.\n", 
             (b->fliplinklevel > 0) ? "fixed" : "auto",
             (b->fliplinklevel > 0) ? b->fliplinklevel : autofliplinklevel,
             remptlist->objects);
    }

    // Remove the list of points.
    for (i = 0; i < remptlist->objects; i++) {
      parypt = (point *) fastlookup(remptlist, i);
      if (removevertexbyflips(*parypt)) {
        // Move the last entry to the current place.
        plastpt = (point *) fastlookup(remptlist, remptlist->objects - 1);
        *parypt = *plastpt;
        remptlist->objects--;
        i--;
      }
    }

    if (remptlist->objects > 0l) {
      if (b->fliplinklevel >= 0) {
        break; // We have tried all levels.
      }
      if (remptlist->objects == ms) {
        nit++;
        if (nit >= 3) {
          // Do the last round with unbounded flip link level.
          b->fliplinklevel = 100000;
        }
      } else {
        ms = remptlist->objects;
        if (nit > 0) {
          nit--;
        }
      }
      autofliplinklevel+=b->fliplinklevelinc;
    } else {
      // All points are removed.
      break;
    }
  } // while (1)

  if (remptlist->objects > 0l) {
    if (b->verbose) {
      printf("  %ld points are not removed !\n", remptlist->objects);
    }
  }

  b->fliplinklevel = bak_fliplinklevel;
  delete remptlist;
}